

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O0

FArchive * __thiscall FArchive::ReadObject(FArchive *this,DObject **obj,PClass *wanttype)

{
  _func_int **pp_Var1;
  uint uVar2;
  DWORD DVar3;
  uint uVar4;
  DObject **ppDVar5;
  AActor *pAVar6;
  DObject *pDVar7;
  AActor *local_88;
  AActor *local_80;
  AInventory *local_60;
  AInventory *item_1;
  AActor *tempobj_1;
  AInventory *item;
  AActor *tempobj;
  DObject *newobj;
  DWORD index;
  BYTE playerNum;
  PClass *type;
  PClass *pPStack_20;
  BYTE objHead;
  PClass *wanttype_local;
  DObject **obj_local;
  FArchive *this_local;
  
  pPStack_20 = wanttype;
  wanttype_local = (PClass *)obj;
  obj_local = (DObject **)this;
  operator<<(this,(BYTE *)((long)&type + 7));
  switch(type._7_1_) {
  case 3:
    DVar3 = ReadCount(this);
    newobj._0_4_ = DVar3;
    uVar4 = TArray<DObject_*,_DObject_*>::Size(&this->ArchiveToObject);
    uVar2 = (DWORD)newobj;
    if (uVar4 <= DVar3) {
      uVar4 = TArray<DObject_*,_DObject_*>::Size(&this->ArchiveToObject);
      I_Error("Object reference too high (%u; max is %u)\n",(ulong)uVar2,(ulong)uVar4);
    }
    ppDVar5 = TArray<DObject_*,_DObject_*>::operator[](&this->ArchiveToObject,(ulong)(DWORD)newobj);
    (wanttype_local->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject.
    _vptr_DObject = (_func_int **)*ppDVar5;
    break;
  case 4:
    (wanttype_local->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject.
    _vptr_DObject = (_func_int **)0x0;
    break;
  case 5:
    operator<<(this,(BYTE *)((long)&newobj + 7));
    if ((this->m_HubTravel & 1U) != 0) {
      _index = ReadStoredClass(this,pPStack_20);
      (wanttype_local->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject
      ._vptr_DObject = (_func_int **)(&players)[(ulong)newobj._7_1_ * 0x54];
      pAVar6 = (AActor *)PClass::CreateNew(_index);
      local_88 = pAVar6;
      if ((wanttype_local->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
          super_DObject._vptr_DObject != (_func_int **)0x0) {
        local_88 = (AActor *)
                   (wanttype_local->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                   super_DObject._vptr_DObject;
      }
      MapObject(this,(DObject *)local_88);
      DObject::SerializeUserVars((DObject *)pAVar6,this);
      (*(pAVar6->super_DThinker).super_DObject._vptr_DObject[3])(pAVar6,this);
      DObject::CheckIfSerialized((DObject *)pAVar6);
      if ((wanttype_local->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
          super_DObject._vptr_DObject != (_func_int **)0x0) {
        for (local_60 = ::TObjPtr::operator_cast_to_AInventory_((TObjPtr *)&pAVar6->Inventory);
            local_60 != (AInventory *)0x0;
            local_60 = ::TObjPtr::operator_cast_to_AInventory_
                                 ((TObjPtr *)&(local_60->super_AActor).Inventory)) {
          TObjPtr<AActor>::operator=(&local_60->Owner,pAVar6);
        }
        (*(pAVar6->super_DThinker).super_DObject._vptr_DObject[4])();
        return this;
      }
      (wanttype_local->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject
      ._vptr_DObject = (_func_int **)pAVar6;
      (&players)[(ulong)newobj._7_1_ * 0x54] =
           (wanttype_local->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
           super_DObject._vptr_DObject;
      return this;
    }
  case 1:
    _index = ReadStoredClass(this,pPStack_20);
    pDVar7 = PClass::CreateNew(_index);
    (wanttype_local->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject.
    _vptr_DObject = (_func_int **)pDVar7;
    MapObject(this,(DObject *)
                   (wanttype_local->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                   super_DObject._vptr_DObject);
    DObject::SerializeUserVars
              ((DObject *)
               (wanttype_local->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
               super_DObject._vptr_DObject,this);
    pp_Var1 = (wanttype_local->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
              super_DObject._vptr_DObject;
    (**(code **)(*pp_Var1 + 0x18))(pp_Var1,this);
    DObject::CheckIfSerialized
              ((DObject *)
               (wanttype_local->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
               super_DObject._vptr_DObject);
    break;
  case 6:
    operator<<(this,(BYTE *)((long)&newobj + 7));
    if ((this->m_HubTravel & 1U) != 0) {
      _index = ReadClass(this,pPStack_20);
      (wanttype_local->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject
      ._vptr_DObject = (_func_int **)(&players)[(ulong)newobj._7_1_ * 0x54];
      pAVar6 = (AActor *)PClass::CreateNew(_index);
      local_80 = pAVar6;
      if ((wanttype_local->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
          super_DObject._vptr_DObject != (_func_int **)0x0) {
        local_80 = (AActor *)
                   (wanttype_local->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                   super_DObject._vptr_DObject;
      }
      MapObject(this,(DObject *)local_80);
      DObject::SerializeUserVars((DObject *)pAVar6,this);
      (*(pAVar6->super_DThinker).super_DObject._vptr_DObject[3])(pAVar6,this);
      DObject::CheckIfSerialized((DObject *)pAVar6);
      if ((wanttype_local->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
          super_DObject._vptr_DObject != (_func_int **)0x0) {
        for (tempobj_1 = &::TObjPtr::operator_cast_to_AInventory_((TObjPtr *)&pAVar6->Inventory)->
                          super_AActor; tempobj_1 != (AActor *)0x0;
            tempobj_1 = &::TObjPtr::operator_cast_to_AInventory_((TObjPtr *)&tempobj_1->Inventory)->
                         super_AActor) {
          TObjPtr<AActor>::operator=((TObjPtr<AActor> *)(tempobj_1 + 1),pAVar6);
        }
        (*(pAVar6->super_DThinker).super_DObject._vptr_DObject[4])();
        return this;
      }
      (wanttype_local->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject
      ._vptr_DObject = (_func_int **)pAVar6;
      (&players)[(ulong)newobj._7_1_ * 0x54] =
           (wanttype_local->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
           super_DObject._vptr_DObject;
      return this;
    }
  case 2:
    _index = ReadClass(this,pPStack_20);
    pDVar7 = PClass::CreateNew(_index);
    (wanttype_local->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject.
    _vptr_DObject = (_func_int **)pDVar7;
    MapObject(this,(DObject *)
                   (wanttype_local->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                   super_DObject._vptr_DObject);
    DObject::SerializeUserVars(pDVar7,this);
    (*pDVar7->_vptr_DObject[3])(pDVar7,this);
    DObject::CheckIfSerialized(pDVar7);
    break;
  default:
    I_Error("Unknown object code (%d) in archive\n",(ulong)type._7_1_);
    break;
  case 0x2c:
    (wanttype_local->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject.
    _vptr_DObject = (_func_int **)0xffffffffffffffff;
  }
  return this;
}

Assistant:

FArchive &FArchive::ReadObject (DObject* &obj, PClass *wanttype)
{
	BYTE objHead;
	const PClass *type;
	BYTE playerNum;
	DWORD index;
	DObject *newobj;

	operator<< (objHead);

	switch (objHead)
	{
	case NULL_OBJ:
		obj = NULL;
		break;

	case M1_OBJ:
		obj = (DObject *)~0;
		break;

	case OLD_OBJ:
		index = ReadCount();
		if (index >= ArchiveToObject.Size())
		{
			I_Error ("Object reference too high (%u; max is %u)\n", index, ArchiveToObject.Size());
		}
		obj = ArchiveToObject[index];
		break;

	case NEW_PLYR_CLS_OBJ:
		operator<< (playerNum);
		if (m_HubTravel)
		{
			// If travelling inside a hub, use the existing player actor
			type = ReadClass (wanttype);
//			Printf ("New player class: %s (%u)\n", type->Name, m_File->Tell());
			obj = players[playerNum].mo;

			// But also create a new one so that we can get past the one
			// stored in the archive.
			AActor *tempobj = static_cast<AActor *>(type->CreateNew ());
			MapObject (obj != NULL ? obj : tempobj);
			tempobj->SerializeUserVars (*this);
			tempobj->Serialize (*this);
			tempobj->CheckIfSerialized ();
			// If this player is not present anymore, keep the new body
			// around just so that the load will succeed.
			if (obj != NULL)
			{
				// When the temporary player's inventory items were loaded,
				// they became owned by the real player. Undo that now.
				for (AInventory *item = tempobj->Inventory; item != NULL; item = item->Inventory)
				{
					item->Owner = tempobj;
				}
				tempobj->Destroy ();
			}
			else
			{
				obj = tempobj;
				players[playerNum].mo = static_cast<APlayerPawn *>(obj);
			}
			break;
		}
		/* fallthrough when not travelling to a previous level */
	case NEW_CLS_OBJ:
		type = ReadClass (wanttype);
//		Printf ("New class: %s (%u)\n", type->Name, m_File->Tell());
		newobj = obj = type->CreateNew ();
		MapObject (obj);
		newobj->SerializeUserVars (*this);
		newobj->Serialize (*this);
		newobj->CheckIfSerialized ();
		break;

	case NEW_PLYR_OBJ:
		operator<< (playerNum);
		if (m_HubTravel)
		{
			type = ReadStoredClass (wanttype);
//			Printf ("Use player class: %s (%u)\n", type->Name, m_File->Tell());
			obj = players[playerNum].mo;

			AActor *tempobj = static_cast<AActor *>(type->CreateNew ());
			MapObject (obj != NULL ? obj : tempobj);
			tempobj->SerializeUserVars (*this);
			tempobj->Serialize (*this);
			tempobj->CheckIfSerialized ();
			if (obj != NULL)
			{
				for (AInventory *item = tempobj->Inventory;
					item != NULL; item = item->Inventory)
				{
					item->Owner = tempobj;
				}
				tempobj->Destroy ();
			}
			else
			{
				obj = tempobj;
				players[playerNum].mo = static_cast<APlayerPawn *>(obj);
			}
			break;
		}
		/* fallthrough when not travelling to a previous level */
	case NEW_OBJ:
		type = ReadStoredClass (wanttype);
//		Printf ("Use class: %s (%u)\n", type->Name, m_File->Tell());
		obj = type->CreateNew ();
		MapObject (obj);
		obj->SerializeUserVars (*this);
		obj->Serialize (*this);
		obj->CheckIfSerialized ();
		break;

	default:
		I_Error ("Unknown object code (%d) in archive\n", objHead);
	}
	return *this;
}